

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ascii-parser.cc
# Opt level: O1

bool __thiscall
tinyusdz::ascii::AsciiParser::ParseBlock
          (AsciiParser *this,Specifier spec,int64_t primIdx,int64_t parentPrimIdx,uint32_t depth,
          bool in_variantStaement)

{
  map<_40cfd1d7_> *this_00;
  _Rb_tree_header *p_Var1;
  _Base_ptr *pp_Var2;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar3;
  uint8_t uVar4;
  bool bVar5;
  bool bVar6;
  char cVar7;
  int iVar8;
  ostream *poVar9;
  StreamReader *pSVar10;
  long lVar11;
  const_iterator cVar12;
  _Any_data *p_Var13;
  long *plVar14;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args;
  size_type *psVar15;
  Specifier s;
  Specifier s_00;
  vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_> *extraout_RDX;
  vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_> *extraout_RDX_00;
  vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_> *extraout_RDX_01;
  vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_> *propNames_00;
  ulong uVar16;
  char *pcVar17;
  Path *__args_3;
  bool bVar18;
  Specifier local_534;
  string variantName;
  char local_510;
  string pTy;
  Identifier def;
  char c_1;
  undefined7 uStack_4c7;
  undefined8 uStack_4c0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_4b8;
  _Any_data *local_4a8;
  uint32_t local_49c;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::ascii::AsciiParser::VariantContent,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::ascii::AsciiParser::VariantContent>_>_>
  vmap;
  string prim_name;
  Identifier prim_type;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_388;
  ostringstream ss_e;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_358 [6];
  ios_base local_2f8 [264];
  stack<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *local_1f0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1e8;
  Identifier tok;
  vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_> propNames;
  VariantSetList variantSetList;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property>_>_>
  props;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<tinyusdz::ListEditQual,_tinyusdz::MetaVariable>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<tinyusdz::ListEditQual,_tinyusdz::MetaVariable>_>_>_>
  in_metas;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  bVar5 = SkipCommentAndWhitespaceAndNewline(this,true);
  if (!bVar5) {
    return false;
  }
  def.super_string._M_dataplus._M_p = (pointer)&def.super_string.field_2;
  def.super_string._M_string_length = 0;
  def.super_string.field_2._M_local_buf[0] = '\0';
  bVar5 = ReadIdentifier(this,&def.super_string);
  if (bVar5) {
    iVar8 = ::std::__cxx11::string::compare((char *)&def);
    if (((iVar8 == 0) || (iVar8 = ::std::__cxx11::string::compare((char *)&def), iVar8 == 0)) ||
       (iVar8 = ::std::__cxx11::string::compare((char *)&def), iVar8 == 0)) {
      iVar8 = ::std::__cxx11::string::compare((char *)&def);
      if (iVar8 == 0) {
        if (spec != Def) {
          ::std::__cxx11::ostringstream::ostringstream((ostringstream *)&ss_e);
          ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&ss_e,"[error]",7);
          ::std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&ss_e,
                     "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/ascii-parser.cc"
                     ,0x56);
          ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&ss_e,"[ASCII]",7);
          ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&ss_e,":",1);
          ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&ss_e,"ParseBlock",10);
          ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&ss_e,"():",3);
          iVar8 = 0x12db;
          goto LAB_003590d5;
        }
      }
      else {
        iVar8 = ::std::__cxx11::string::compare((char *)&def);
        if (iVar8 == 0) {
          if (spec != Over) {
            ::std::__cxx11::ostringstream::ostringstream((ostringstream *)&ss_e);
            ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&ss_e,"[error]",7);
            ::std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)&ss_e,
                       "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/ascii-parser.cc"
                       ,0x56);
            ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&ss_e,"[ASCII]",7);
            ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&ss_e,":",1);
            ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&ss_e,"ParseBlock",10);
            ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&ss_e,"():",3);
            iVar8 = 0x12e1;
            goto LAB_003590d5;
          }
        }
        else {
          iVar8 = ::std::__cxx11::string::compare((char *)&def);
          if ((spec != Class) && (iVar8 == 0)) {
            ::std::__cxx11::ostringstream::ostringstream((ostringstream *)&ss_e);
            ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&ss_e,"[error]",7);
            ::std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)&ss_e,
                       "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/ascii-parser.cc"
                       ,0x56);
            ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&ss_e,"[ASCII]",7);
            ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&ss_e,":",1);
            ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&ss_e,"ParseBlock",10);
            ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&ss_e,"():",3);
            iVar8 = 0x12e7;
LAB_003590d5:
            poVar9 = (ostream *)::std::ostream::operator<<((ostream *)&ss_e,iVar8);
            ::std::__ostream_insert<char,std::char_traits<char>>(poVar9," ",1);
            ::std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)&ss_e,
                       "Internal error. Invalid Specifier token combination. def = ",0x3b);
            poVar9 = ::std::__ostream_insert<char,std::char_traits<char>>
                               ((ostream *)&ss_e,def.super_string._M_dataplus._M_p,
                                def.super_string._M_string_length);
            ::std::__ostream_insert<char,std::char_traits<char>>(poVar9,", spec = ",9);
            tinyusdz::to_string_abi_cxx11_((string *)&vmap,(tinyusdz *)(ulong)spec,s);
            poVar9 = ::std::__ostream_insert<char,std::char_traits<char>>
                               (poVar9,(char *)vmap._M_t._M_impl._0_8_,
                                CONCAT44(vmap._M_t._M_impl.super__Rb_tree_header._M_header._4_4_,
                                         vmap._M_t._M_impl.super__Rb_tree_header._M_header._M_color)
                               );
            ::std::__ostream_insert<char,std::char_traits<char>>(poVar9,"\n",1);
            pp_Var2 = &vmap._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
            if ((_Base_ptr *)vmap._M_t._M_impl._0_8_ != pp_Var2) {
              operator_delete((void *)vmap._M_t._M_impl._0_8_,
                              (ulong)((long)&(vmap._M_t._M_impl.super__Rb_tree_header._M_header.
                                             _M_parent)->_M_color + 1));
            }
            ::std::__cxx11::stringbuf::str();
            PushError(this,(string *)&vmap);
            if ((_Base_ptr *)vmap._M_t._M_impl._0_8_ != pp_Var2) goto LAB_003591ab;
            goto LAB_003591bb;
          }
        }
      }
      bVar5 = SkipWhitespaceAndNewline(this,true);
      if (bVar5) {
        pSVar10 = this->_sr;
        uVar16 = pSVar10->idx_ + 1;
        if (pSVar10->length_ < uVar16) {
          bVar18 = false;
          bVar6 = false;
        }
        else {
          uVar4 = pSVar10->binary_[pSVar10->idx_];
          pSVar10->idx_ = uVar16;
          bVar18 = uVar4 != '\"';
          uVar16 = pSVar10->idx_ - 1;
          bVar5 = uVar16 <= pSVar10->length_;
          bVar6 = bVar5 && -1 < (long)uVar16;
          if (bVar5 && -1 < (long)uVar16) {
            pSVar10->idx_ = uVar16;
          }
          else {
            bVar18 = false;
          }
        }
        if (bVar6) {
          prim_type.super_string._M_dataplus._M_p = (pointer)&prim_type.super_string.field_2;
          prim_type.super_string._M_string_length = 0;
          prim_type.super_string.field_2._M_local_buf[0] = '\0';
          if (((bVar18) && (bVar5 = ReadIdentifier(this,&prim_type.super_string), !bVar5)) ||
             (bVar5 = SkipWhitespaceAndNewline(this,true), !bVar5)) {
            bVar5 = false;
          }
          else {
            prim_name._M_dataplus._M_p = (pointer)&prim_name.field_2;
            prim_name._M_string_length = 0;
            prim_name.field_2._M_local_buf[0] = '\0';
            bVar5 = ReadBasicType(this,&prim_name);
            if (bVar5) {
              bVar5 = ValidatePrimElementName(&prim_name);
              if (!bVar5) {
                ::std::__cxx11::ostringstream::ostringstream((ostringstream *)&ss_e);
                ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&ss_e,"[error]",7);
                ::std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)&ss_e,
                           "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/ascii-parser.cc"
                           ,0x56);
                ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&ss_e,"[ASCII]",7);
                ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&ss_e,":",1);
                ::std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)&ss_e,"ParseBlock",10);
                ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&ss_e,"():",3);
                poVar9 = (ostream *)::std::ostream::operator<<((ostringstream *)&ss_e,0x1318);
                ::std::__ostream_insert<char,std::char_traits<char>>(poVar9," ",1);
                ::std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)&ss_e,"Prim name contains invalid chacracter.",0x26);
                ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&ss_e,"\n",1);
                ::std::__cxx11::stringbuf::str();
                PushError(this,(string *)&vmap);
                if ((_Base_ptr *)vmap._M_t._M_impl._0_8_ !=
                    &vmap._M_t._M_impl.super__Rb_tree_header._M_header._M_parent) {
                  operator_delete((void *)vmap._M_t._M_impl._0_8_,
                                  (ulong)((long)&(vmap._M_t._M_impl.super__Rb_tree_header._M_header.
                                                 _M_parent)->_M_color + 1));
                }
                ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)&ss_e);
                ::std::ios_base::~ios_base(local_2f8);
                goto LAB_00359597;
              }
              bVar5 = SkipWhitespaceAndNewline(this,true);
              if (!bVar5) goto LAB_00359597;
              in_metas._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
                   &in_metas._M_t._M_impl.super__Rb_tree_header._M_header;
              in_metas._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
              in_metas._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
              in_metas._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
              in_metas._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
                   in_metas._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
              bVar5 = LookChar1(this,(char *)&ss_e);
              if (((bVar5) &&
                  (((ss_e != (ostringstream)0x28 ||
                    ((bVar5 = ParsePrimMetas(this,&in_metas), bVar5 &&
                     (bVar5 = SkipWhitespaceAndNewline(this,true), bVar5)))) &&
                   (bVar5 = SkipCommentAndWhitespaceAndNewline(this,true), bVar5)))) &&
                 (bVar5 = Expect(this,'{'), bVar5)) {
                bVar6 = SkipWhitespaceAndNewline(this,true);
                bVar5 = false;
                if (bVar6) {
                  props._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
                       &props._M_t._M_impl.super__Rb_tree_header._M_header;
                  props._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
                  props._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
                  props._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
                  propNames.super__Vector_base<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>.
                  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
                  propNames.super__Vector_base<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>.
                  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
                  propNames.super__Vector_base<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>.
                  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
                  variantSetList._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
                       &variantSetList._M_t._M_impl.super__Rb_tree_header._M_header;
                  variantSetList._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
                  variantSetList._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
                       (_Base_ptr)0x0;
                  variantSetList._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
                  variantSetList._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
                       variantSetList._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
                  props._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
                       props._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
                  GetCurrentPrimPath_abi_cxx11_((string *)&ss_e,this);
                  iVar8 = ::std::__cxx11::string::compare((char *)&ss_e);
                  if (iVar8 == 0) {
                    ::std::__cxx11::string::_M_append
                              ((char *)&ss_e,(ulong)prim_name._M_dataplus._M_p);
                  }
                  else {
                    ::std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                      *)&vmap,"/",
                                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                      *)&prim_name);
                    ::std::__cxx11::string::_M_append((char *)&ss_e,vmap._M_t._M_impl._0_8_);
                    if ((_Base_ptr *)vmap._M_t._M_impl._0_8_ !=
                        &vmap._M_t._M_impl.super__Rb_tree_header._M_header._M_parent) {
                      operator_delete((void *)vmap._M_t._M_impl._0_8_,
                                      (ulong)((long)&(vmap._M_t._M_impl.super__Rb_tree_header.
                                                      _M_header._M_parent)->_M_color + 1));
                    }
                  }
                  local_1f0 = &this->_path_stack;
                  ::std::
                  deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ::push_back(&local_1f0->c,(value_type *)&ss_e);
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)_ss_e != local_358) {
                    operator_delete(_ss_e,local_358[0]._M_allocated_capacity + 1);
                  }
                  pSVar10 = this->_sr;
                  args = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         pSVar10->idx_;
                  if (args < (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             pSVar10->length_) {
                    local_4a8 = (_Any_data *)&this->_prim_idx_assign_fun;
                    local_49c = depth + 1;
                    do {
                      if (*(uint8_t *)((long)&(args->_M_dataplus)._M_p + (long)pSVar10->binary_) ==
                          '\0') break;
                      bVar5 = SkipCommentAndWhitespaceAndNewline(this,true);
                      if (!bVar5) {
LAB_0035a522:
                        bVar5 = false;
                        goto LAB_0035aca0;
                      }
                      pSVar10 = this->_sr;
                      args = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             (pSVar10->idx_ + 1);
                      if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          pSVar10->length_ < args) {
LAB_003596bb:
                        cVar7 = '\x01';
                      }
                      else {
                        uVar4 = pSVar10->binary_[pSVar10->idx_];
                        c_1 = uVar4;
                        pSVar10->idx_ = (uint64_t)args;
                        cVar7 = '\r';
                        if (uVar4 != '}') {
                          args = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                  *)(pSVar10->idx_ - 1);
                          if ((long)args < 0) goto LAB_003596bb;
                          cVar7 = '\x01';
                          if (args <= (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                       *)pSVar10->length_) {
                            pSVar10->idx_ = (uint64_t)args;
                            tok.super_string._M_dataplus._M_p = (pointer)&tok.super_string.field_2;
                            tok.super_string._M_string_length = 0;
                            tok.super_string.field_2._M_local_buf[0] = '\0';
                            bVar5 = ReadBasicType(this,&tok);
                            if (bVar5) {
                              iVar8 = ::std::__cxx11::string::compare((char *)&tok);
                              if (iVar8 == 0) {
                                bVar5 = SkipWhitespace(this);
                                cVar7 = '\x01';
                                if (bVar5) {
                                  variantName._M_dataplus._M_p = (pointer)&variantName.field_2;
                                  variantName._M_string_length = 0;
                                  variantName.field_2._M_local_buf[0] = '\0';
                                  bVar5 = ReadBasicType(this,&variantName);
                                  if (bVar5) {
                                    bVar5 = SkipWhitespace(this);
                                    cVar7 = '\x01';
                                    if (((bVar5) && (bVar5 = Expect(this,'='), bVar5)) &&
                                       (bVar5 = SkipWhitespace(this), bVar5)) {
                                      vmap._M_t._M_impl.super__Rb_tree_header._M_header._M_color =
                                           _S_red;
                                      vmap._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
                                           (_Base_ptr)0x0;
                                      vmap._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
                                           &vmap._M_t._M_impl.super__Rb_tree_header._M_header;
                                      vmap._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
                                      args = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                              *)(ulong)depth;
                                      vmap._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
                                           vmap._M_t._M_impl.super__Rb_tree_header._M_header._M_left
                                      ;
                                      bVar5 = ParseVariantSet(this,primIdx,parentPrimIdx,depth,&vmap
                                                             );
                                      if (bVar5) {
                                        ::std::
                                        _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::map<std::__cxx11::string,tinyusdz::ascii::AsciiParser::VariantContent,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,tinyusdz::ascii::AsciiParser::VariantContent>>>>,std::_Select1st<std::pair<std::__cxx11::string_const,std::map<std::__cxx11::string,tinyusdz::ascii::AsciiParser::VariantContent,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,tinyusdz::ascii::AsciiParser::VariantContent>>>>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::map<std::__cxx11::string,tinyusdz::ascii::AsciiParser::VariantContent,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,tinyusdz::ascii::AsciiParser::VariantContent>>>>>>
                                        ::
                                        _M_emplace_unique<std::__cxx11::string&,std::map<std::__cxx11::string,tinyusdz::ascii::AsciiParser::VariantContent,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,tinyusdz::ascii::AsciiParser::VariantContent>>>&>
                                                  ((
                                                  _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::map<std::__cxx11::string,tinyusdz::ascii::AsciiParser::VariantContent,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,tinyusdz::ascii::AsciiParser::VariantContent>>>>,std::_Select1st<std::pair<std::__cxx11::string_const,std::map<std::__cxx11::string,tinyusdz::ascii::AsciiParser::VariantContent,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,tinyusdz::ascii::AsciiParser::VariantContent>>>>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::map<std::__cxx11::string,tinyusdz::ascii::AsciiParser::VariantContent,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,tinyusdz::ascii::AsciiParser::VariantContent>>>>>>
                                                  *)&variantSetList,&variantName,&vmap);
                                        cVar7 = '\f';
                                      }
                                      else {
                                        ::std::__cxx11::ostringstream::ostringstream
                                                  ((ostringstream *)&ss_e);
                                        ::std::__ostream_insert<char,std::char_traits<char>>
                                                  ((ostream *)&ss_e,"[error]",7);
                                        ::std::__ostream_insert<char,std::char_traits<char>>
                                                  ((ostream *)&ss_e,
                                                                                                      
                                                  "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/ascii-parser.cc"
                                                  ,0x56);
                                        ::std::__ostream_insert<char,std::char_traits<char>>
                                                  ((ostream *)&ss_e,":",1);
                                        ::std::__ostream_insert<char,std::char_traits<char>>
                                                  ((ostream *)&ss_e,"ParseBlock",10);
                                        ::std::__ostream_insert<char,std::char_traits<char>>
                                                  ((ostream *)&ss_e,"():",3);
                                        poVar9 = (ostream *)
                                                 ::std::ostream::operator<<
                                                           ((ostringstream *)&ss_e,0x138e);
                                        ::std::__ostream_insert<char,std::char_traits<char>>
                                                  (poVar9," ",1);
                                        ::std::__ostream_insert<char,std::char_traits<char>>
                                                  ((ostream *)&ss_e,
                                                   "Failed to parse `variantSet` statement.",0x27);
                                        ::std::__ostream_insert<char,std::char_traits<char>>
                                                  ((ostream *)&ss_e,"\n",1);
                                        ::std::__cxx11::stringbuf::str();
                                        PushError(this,&pTy);
                                        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                             *)pTy._M_dataplus._M_p != &pTy.field_2) {
                                          operator_delete(pTy._M_dataplus._M_p,
                                                          pTy.field_2._M_allocated_capacity + 1);
                                        }
                                        ::std::__cxx11::ostringstream::~ostringstream
                                                  ((ostringstream *)&ss_e);
                                        ::std::ios_base::~ios_base(local_2f8);
                                        cVar7 = '\x01';
                                      }
                                      ::std::
                                      _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::ascii::AsciiParser::VariantContent>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::ascii::AsciiParser::VariantContent>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::ascii::AsciiParser::VariantContent>_>_>
                                      ::_M_erase(&vmap._M_t,
                                                 (_Link_type)
                                                 vmap._M_t._M_impl.super__Rb_tree_header._M_header.
                                                 _M_parent);
                                    }
                                  }
                                  else {
                                    ::std::__cxx11::ostringstream::ostringstream
                                              ((ostringstream *)&ss_e);
                                    ::std::__ostream_insert<char,std::char_traits<char>>
                                              ((ostream *)&ss_e,"[error]",7);
                                    ::std::__ostream_insert<char,std::char_traits<char>>
                                              ((ostream *)&ss_e,
                                               "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/ascii-parser.cc"
                                               ,0x56);
                                    ::std::__ostream_insert<char,std::char_traits<char>>
                                              ((ostream *)&ss_e,":",1);
                                    ::std::__ostream_insert<char,std::char_traits<char>>
                                              ((ostream *)&ss_e,"ParseBlock",10);
                                    ::std::__ostream_insert<char,std::char_traits<char>>
                                              ((ostream *)&ss_e,"():",3);
                                    poVar9 = (ostream *)
                                             ::std::ostream::operator<<
                                                       ((ostringstream *)&ss_e,0x137b);
                                    ::std::__ostream_insert<char,std::char_traits<char>>
                                              (poVar9," ",1);
                                    ::std::__ostream_insert<char,std::char_traits<char>>
                                              ((ostream *)&ss_e,
                                               "Failed to parse `variantSet` statement.",0x27);
                                    ::std::__ostream_insert<char,std::char_traits<char>>
                                              ((ostream *)&ss_e,"\n",1);
                                    ::std::__cxx11::stringbuf::str();
                                    PushError(this,(string *)&vmap);
                                    if ((_Base_ptr *)vmap._M_t._M_impl._0_8_ !=
                                        &vmap._M_t._M_impl.super__Rb_tree_header._M_header._M_parent
                                       ) {
                                      operator_delete((void *)vmap._M_t._M_impl._0_8_,
                                                      (ulong)((long)&(vmap._M_t._M_impl.
                                                                      super__Rb_tree_header.
                                                                      _M_header._M_parent)->_M_color
                                                             + 1));
                                    }
                                    ::std::__cxx11::ostringstream::~ostringstream
                                              ((ostringstream *)&ss_e);
                                    ::std::ios_base::~ios_base(local_2f8);
                                    cVar7 = '\x01';
                                  }
                                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                       *)variantName._M_dataplus._M_p != &variantName.field_2) {
                                    operator_delete(variantName._M_dataplus._M_p,
                                                    CONCAT71(variantName.field_2.
                                                             _M_allocated_capacity._1_7_,
                                                             variantName.field_2._M_local_buf[0]) +
                                                    1);
                                  }
                                }
                              }
                              else {
                                pSVar10 = this->_sr;
                                args = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                        *)(pSVar10->idx_ - tok.super_string._M_string_length);
                                cVar7 = '\x01';
                                if ((-1 < (long)args) &&
                                   (args <= (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                             *)pSVar10->length_)) {
                                  pSVar10->idx_ = (uint64_t)args;
                                  iVar8 = ::std::__cxx11::string::compare((char *)&tok);
                                  if (iVar8 == 0) {
                                    args = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                            *)0x0;
                                    local_534 = Def;
                                    propNames_00 = extraout_RDX;
                                  }
                                  else {
                                    iVar8 = ::std::__cxx11::string::compare((char *)&tok);
                                    if (iVar8 == 0) {
                                      local_534 = Over;
                                      args = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                              *)0x0;
                                      propNames_00 = extraout_RDX_00;
                                    }
                                    else {
                                      iVar8 = ::std::__cxx11::string::compare((char *)&tok);
                                      args = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                              *)(ulong)(iVar8 != 0);
                                      local_534 = iVar8 != 0 | Class;
                                      propNames_00 = extraout_RDX_01;
                                    }
                                  }
                                  if ((char)args == '\0') {
                                    _ss_e = (pointer)parentPrimIdx;
                                    if ((this->_prim_idx_assign_fun).super__Function_base._M_manager
                                        == (_Manager_type)0x0) {
                                      ::std::__throw_bad_function_call();
                                    }
                                    lVar11 = (*(this->_prim_idx_assign_fun)._M_invoker)
                                                       (local_4a8,(long *)&ss_e);
                                    args = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                            *)primIdx;
                                    bVar5 = ParseBlock(this,local_534,lVar11,primIdx,local_49c,false
                                                      );
                                    if (bVar5) goto LAB_00359dd4;
                                    ::std::__cxx11::ostringstream::ostringstream
                                              ((ostringstream *)&ss_e);
                                    ::std::__ostream_insert<char,std::char_traits<char>>
                                              ((ostream *)&ss_e,"[error]",7);
                                    ::std::__ostream_insert<char,std::char_traits<char>>
                                              ((ostream *)&ss_e,
                                               "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/ascii-parser.cc"
                                               ,0x56);
                                    ::std::__ostream_insert<char,std::char_traits<char>>
                                              ((ostream *)&ss_e,":",1);
                                    ::std::__ostream_insert<char,std::char_traits<char>>
                                              ((ostream *)&ss_e,"ParseBlock",10);
                                    ::std::__ostream_insert<char,std::char_traits<char>>
                                              ((ostream *)&ss_e,"():",3);
                                    poVar9 = (ostream *)::std::ostream::operator<<(&ss_e,0x13ab);
                                    ::std::__ostream_insert<char,std::char_traits<char>>
                                              (poVar9," ",1);
                                    variantName._M_dataplus._M_p = (pointer)&variantName.field_2;
                                    ::std::__cxx11::string::_M_construct<char_const*>
                                              ((string *)&variantName,"`{}` block parse failed.","")
                                    ;
                                    tinyusdz::to_string_abi_cxx11_
                                              (&pTy,(tinyusdz *)(ulong)local_534,s_00);
                                    fmt::format<std::__cxx11::string>
                                              ((string *)&vmap,(fmt *)&variantName,(string *)&pTy,
                                               args);
                                    poVar9 = ::std::__ostream_insert<char,std::char_traits<char>>
                                                       ((ostream *)&ss_e,
                                                        (char *)vmap._M_t._M_impl._0_8_,
                                                        CONCAT44(vmap._M_t._M_impl.
                                                                 super__Rb_tree_header._M_header.
                                                                 _4_4_,vmap._M_t._M_impl.
                                                                       super__Rb_tree_header.
                                                                       _M_header._M_color));
                                    ::std::__ostream_insert<char,std::char_traits<char>>
                                              (poVar9,"\n",1);
                                    if ((_Base_ptr *)vmap._M_t._M_impl._0_8_ !=
                                        &vmap._M_t._M_impl.super__Rb_tree_header._M_header._M_parent
                                       ) {
                                      operator_delete((void *)vmap._M_t._M_impl._0_8_,
                                                      (ulong)((long)&(vmap._M_t._M_impl.
                                                                      super__Rb_tree_header.
                                                                      _M_header._M_parent)->_M_color
                                                             + 1));
                                    }
                                    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                         *)pTy._M_dataplus._M_p != &pTy.field_2) {
                                      operator_delete(pTy._M_dataplus._M_p,
                                                      pTy.field_2._M_allocated_capacity + 1);
                                    }
                                    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                         *)variantName._M_dataplus._M_p != &variantName.field_2) {
                                      operator_delete(variantName._M_dataplus._M_p,
                                                      CONCAT71(variantName.field_2.
                                                               _M_allocated_capacity._1_7_,
                                                               variantName.field_2._M_local_buf[0])
                                                      + 1);
                                    }
                                  }
                                  else {
                                    bVar5 = ParsePrimProps(this,&props,propNames_00);
                                    if (bVar5) {
LAB_00359dd4:
                                      bVar5 = SkipWhitespaceAndNewline(this,true);
                                      cVar7 = !bVar5;
                                      goto LAB_003599d7;
                                    }
                                    ::std::__cxx11::ostringstream::ostringstream
                                              ((ostringstream *)&ss_e);
                                    ::std::__ostream_insert<char,std::char_traits<char>>
                                              ((ostream *)&ss_e,"[error]",7);
                                    ::std::__ostream_insert<char,std::char_traits<char>>
                                              ((ostream *)&ss_e,
                                               "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/ascii-parser.cc"
                                               ,0x56);
                                    ::std::__ostream_insert<char,std::char_traits<char>>
                                              ((ostream *)&ss_e,":",1);
                                    ::std::__ostream_insert<char,std::char_traits<char>>
                                              ((ostream *)&ss_e,"ParseBlock",10);
                                    ::std::__ostream_insert<char,std::char_traits<char>>
                                              ((ostream *)&ss_e,"():",3);
                                    poVar9 = (ostream *)::std::ostream::operator<<(&ss_e,0x13b2);
                                    ::std::__ostream_insert<char,std::char_traits<char>>
                                              (poVar9," ",1);
                                    ::std::__ostream_insert<char,std::char_traits<char>>
                                              ((ostream *)&ss_e,"Failed to parse Prim attribute.",
                                               0x1f);
                                    ::std::__ostream_insert<char,std::char_traits<char>>
                                              ((ostream *)&ss_e,"\n",1);
                                  }
                                  ::std::__cxx11::stringbuf::str();
                                  PushError(this,(string *)&vmap);
                                  if ((_Base_ptr *)vmap._M_t._M_impl._0_8_ !=
                                      &vmap._M_t._M_impl.super__Rb_tree_header._M_header._M_parent)
                                  {
                                    operator_delete((void *)vmap._M_t._M_impl._0_8_,
                                                    (ulong)((long)&(vmap._M_t._M_impl.
                                                                    super__Rb_tree_header._M_header.
                                                                   _M_parent)->_M_color + 1));
                                  }
                                  ::std::__cxx11::ostringstream::~ostringstream
                                            ((ostringstream *)&ss_e);
                                  ::std::ios_base::~ios_base(local_2f8);
                                }
                              }
                            }
                            else {
                              bVar5 = LookChar1(this,&c_1);
                              if ((bVar5) && (c_1 == ';')) {
                                ::std::__cxx11::ostringstream::ostringstream((ostringstream *)&ss_e)
                                ;
                                ::std::__ostream_insert<char,std::char_traits<char>>
                                          ((ostream *)&ss_e,"[error]",7);
                                ::std::__ostream_insert<char,std::char_traits<char>>
                                          ((ostream *)&ss_e,
                                           "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/ascii-parser.cc"
                                           ,0x56);
                                ::std::__ostream_insert<char,std::char_traits<char>>
                                          ((ostream *)&ss_e,":",1);
                                ::std::__ostream_insert<char,std::char_traits<char>>
                                          ((ostream *)&ss_e,"ParseBlock",10);
                                ::std::__ostream_insert<char,std::char_traits<char>>
                                          ((ostream *)&ss_e,"():",3);
                                poVar9 = (ostream *)
                                         ::std::ostream::operator<<((ostringstream *)&ss_e,0x136d);
                                ::std::__ostream_insert<char,std::char_traits<char>>(poVar9," ",1);
                                lVar11 = 0x31;
                                pcVar17 = "Semicolon is not allowd in `def` block statement.";
                              }
                              else {
                                ::std::__cxx11::ostringstream::ostringstream((ostringstream *)&ss_e)
                                ;
                                ::std::__ostream_insert<char,std::char_traits<char>>
                                          ((ostream *)&ss_e,"[error]",7);
                                ::std::__ostream_insert<char,std::char_traits<char>>
                                          ((ostream *)&ss_e,
                                           "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/ascii-parser.cc"
                                           ,0x56);
                                ::std::__ostream_insert<char,std::char_traits<char>>
                                          ((ostream *)&ss_e,":",1);
                                ::std::__ostream_insert<char,std::char_traits<char>>
                                          ((ostream *)&ss_e,"ParseBlock",10);
                                ::std::__ostream_insert<char,std::char_traits<char>>
                                          ((ostream *)&ss_e,"():",3);
                                poVar9 = (ostream *)
                                         ::std::ostream::operator<<((ostringstream *)&ss_e,0x1371);
                                ::std::__ostream_insert<char,std::char_traits<char>>(poVar9," ",1);
                                lVar11 = 0x37;
                                pcVar17 = "Failed to parse an identifier in `def` block statement.";
                              }
                              ::std::__ostream_insert<char,std::char_traits<char>>
                                        ((ostream *)&ss_e,pcVar17,lVar11);
                              ::std::__ostream_insert<char,std::char_traits<char>>
                                        ((ostream *)&ss_e,"\n",1);
                              ::std::__cxx11::stringbuf::str();
                              PushError(this,(string *)&vmap);
                              if ((_Base_ptr *)vmap._M_t._M_impl._0_8_ !=
                                  &vmap._M_t._M_impl.super__Rb_tree_header._M_header._M_parent) {
                                operator_delete((void *)vmap._M_t._M_impl._0_8_,
                                                (ulong)((long)&(vmap._M_t._M_impl.
                                                                super__Rb_tree_header._M_header.
                                                               _M_parent)->_M_color + 1));
                              }
                              ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)&ss_e);
                              ::std::ios_base::~ios_base(local_2f8);
                              cVar7 = '\x01';
                            }
LAB_003599d7:
                            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                 *)tok.super_string._M_dataplus._M_p != &tok.super_string.field_2) {
                              operator_delete(tok.super_string._M_dataplus._M_p,
                                              CONCAT71(tok.super_string.field_2.
                                                       _M_allocated_capacity._1_7_,
                                                       tok.super_string.field_2._M_local_buf[0]) + 1
                                             );
                            }
                          }
                        }
                      }
                      if ((cVar7 != '\0') && (cVar7 != '\f')) {
                        if (cVar7 != '\r') goto LAB_0035a522;
                        break;
                      }
                      pSVar10 = this->_sr;
                      args = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             pSVar10->idx_;
                    } while (args < (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                     *)pSVar10->length_);
                  }
                  pTy._M_dataplus._M_p = (pointer)&pTy.field_2;
                  ::std::__cxx11::string::_M_construct<char*>
                            ((string *)&pTy,prim_type.super_string._M_dataplus._M_p,
                             prim_type.super_string._M_dataplus._M_p +
                             prim_type.super_string._M_string_length);
                  if (this->_primspec_mode == true) {
                    if ((this->_primspec_fun).super__Function_base._M_manager == (_Manager_type)0x0)
                    {
                      ::std::__cxx11::ostringstream::ostringstream((ostringstream *)&ss_e);
                      ::std::__ostream_insert<char,std::char_traits<char>>
                                ((ostream *)&ss_e,"[error]",7);
                      ::std::__ostream_insert<char,std::char_traits<char>>
                                ((ostream *)&ss_e,
                                 "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/ascii-parser.cc"
                                 ,0x56);
                      ::std::__ostream_insert<char,std::char_traits<char>>
                                ((ostream *)&ss_e,"[ASCII]",7);
                      ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&ss_e,":",1);
                      ::std::__ostream_insert<char,std::char_traits<char>>
                                ((ostream *)&ss_e,"ParseBlock",10);
                      ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&ss_e,"():",3)
                      ;
                      poVar9 = (ostream *)::std::ostream::operator<<((ostringstream *)&ss_e,0x13d1);
                      ::std::__ostream_insert<char,std::char_traits<char>>(poVar9," ",1);
                      ::std::__ostream_insert<char,std::char_traits<char>>
                                ((ostream *)&ss_e,"[Internal Error] PrimSpec handler is not found.",
                                 0x2f);
                      ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&ss_e,"\n",1);
                      ::std::__cxx11::stringbuf::str();
                      PushError(this,(string *)&vmap);
                      if ((_Base_ptr *)vmap._M_t._M_impl._0_8_ !=
                          &vmap._M_t._M_impl.super__Rb_tree_header._M_header._M_parent) {
                        operator_delete((void *)vmap._M_t._M_impl._0_8_,
                                        (ulong)((long)&(vmap._M_t._M_impl.super__Rb_tree_header.
                                                        _M_header._M_parent)->_M_color + 1));
                      }
                      ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)&ss_e);
                      ::std::ios_base::~ios_base(local_2f8);
                    }
                    else {
                      GetCurrentPrimPath_abi_cxx11_((string *)&ss_e,this);
                      tok.super_string._M_dataplus._M_p = (pointer)&tok.super_string.field_2;
                      ::std::__cxx11::string::_M_construct<char_const*>
                                ((string *)&tok.super_string,"");
                      Path::Path((Path *)&vmap,(string *)&ss_e,&tok.super_string);
                      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                           *)tok.super_string._M_dataplus._M_p != &tok.super_string.field_2) {
                        operator_delete(tok.super_string._M_dataplus._M_p,
                                        CONCAT71(tok.super_string.field_2._M_allocated_capacity.
                                                 _1_7_,tok.super_string.field_2._M_local_buf[0]) + 1
                                       );
                      }
                      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                           *)_ss_e != local_358) {
                        operator_delete(_ss_e,local_358[0]._M_allocated_capacity + 1);
                      }
                      local_4a8 = (_Any_data *)&this->_primspec_fun;
                      _ss_e = (pointer)local_358;
                      ::std::__cxx11::string::_M_construct<char_const*>((string *)&ss_e,"");
                      Path::Path((Path *)&tok,&prim_name,(string *)&ss_e);
                      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                           *)_ss_e != local_358) {
                        operator_delete(_ss_e,local_358[0]._M_allocated_capacity + 1);
                      }
                      __args_3 = (Path *)&tok;
                      ::std::function<$3792144$>::operator()
                                ((expected<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                  *)&variantName,(function<_3792144_> *)local_4a8,(Path *)&vmap,spec
                                 ,&prim_type.super_string,__args_3,primIdx,parentPrimIdx,&props,
                                 &in_metas,&variantSetList);
                      if (local_510 != '\0') {
                        Path::~Path((Path *)&tok);
                        Path::~Path((Path *)&vmap);
                        goto LAB_0035a7fa;
                      }
                      ::std::__cxx11::ostringstream::ostringstream((ostringstream *)&ss_e);
                      ::std::__ostream_insert<char,std::char_traits<char>>
                                ((ostream *)&ss_e,"[error]",7);
                      ::std::__ostream_insert<char,std::char_traits<char>>
                                ((ostream *)&ss_e,
                                 "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/ascii-parser.cc"
                                 ,0x56);
                      ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&ss_e,":",1);
                      ::std::__ostream_insert<char,std::char_traits<char>>
                                ((ostream *)&ss_e,"ParseBlock",10);
                      ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&ss_e,"():",3)
                      ;
                      poVar9 = (ostream *)::std::ostream::operator<<((ostringstream *)&ss_e,0x13cd);
                      ::std::__ostream_insert<char,std::char_traits<char>>(poVar9," ",1);
                      local_388._M_dataplus._M_p = (pointer)&local_388.field_2;
                      ::std::__cxx11::string::_M_construct<char_const*>
                                ((string *)&local_388,
                                 "Constructing PrimSpec typeName `{}`, elementName `{}` failed: {}",
                                 "");
                      fmt::
                      format<tinyusdz::ascii::Identifier,std::__cxx11::string,std::__cxx11::string>
                                ((string *)&c_1,(fmt *)&local_388,&prim_type.super_string,
                                 (Identifier *)&prim_name,&variantName,
                                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                  *)__args_3);
                      poVar9 = ::std::__ostream_insert<char,std::char_traits<char>>
                                         ((ostream *)&ss_e,(char *)_c_1,uStack_4c0);
                      ::std::__ostream_insert<char,std::char_traits<char>>(poVar9,"\n",1);
                      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                           *)_c_1 != &local_4b8) {
                        operator_delete((void *)_c_1,(ulong)(local_4b8._M_allocated_capacity + 1));
                      }
                      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                           *)local_388._M_dataplus._M_p != &local_388.field_2) {
                        operator_delete(local_388._M_dataplus._M_p,
                                        local_388.field_2._M_allocated_capacity + 1);
                      }
                      ::std::__cxx11::stringbuf::str();
                      PushError(this,(string *)&c_1);
                      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                           *)_c_1 != &local_4b8) {
                        operator_delete((void *)_c_1,(ulong)(local_4b8._M_allocated_capacity + 1));
                      }
                      ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)&ss_e);
                      ::std::ios_base::~ios_base(local_2f8);
                      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                           *)variantName._M_dataplus._M_p != &variantName.field_2) {
                        operator_delete(variantName._M_dataplus._M_p,
                                        CONCAT71(variantName.field_2._M_allocated_capacity._1_7_,
                                                 variantName.field_2._M_local_buf[0]) + 1);
                      }
                      Path::~Path((Path *)&tok);
                      Path::~Path((Path *)&vmap);
                    }
LAB_0035ac81:
                    bVar5 = false;
                  }
                  else {
                    if (prim_type.super_string._M_string_length == 0) {
                      ::std::__cxx11::string::operator=((string *)&pTy,"Model");
                    }
                    this_00 = &this->_prim_construct_fun_map;
                    cVar12 = ::std::_Rb_tree<$d8d97b32$>::find(&this_00->_M_t,&pTy);
                    p_Var1 = &(this->_prim_construct_fun_map)._M_t._M_impl.super__Rb_tree_header;
                    if (((_Rb_tree_header *)cVar12._M_node == p_Var1) &&
                       ((this->_option).allow_unknown_prim == true)) {
                      ::std::__cxx11::string::operator=((string *)&pTy,"Model");
                    }
                    cVar12 = ::std::_Rb_tree<$d8d97b32$>::find(&this_00->_M_t,&pTy);
                    if ((_Rb_tree_header *)cVar12._M_node == p_Var1) {
                      ::std::__cxx11::ostringstream::ostringstream((ostringstream *)&ss_e);
                      ::std::__ostream_insert<char,std::char_traits<char>>
                                ((ostream *)&ss_e,"[warn]",6);
                      ::std::__ostream_insert<char,std::char_traits<char>>
                                ((ostream *)&ss_e,
                                 "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/ascii-parser.cc"
                                 ,0x56);
                      ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&ss_e,":",1);
                      ::std::__ostream_insert<char,std::char_traits<char>>
                                ((ostream *)&ss_e,"ParseBlock",10);
                      ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&ss_e,"():",3)
                      ;
                      poVar9 = (ostream *)::std::ostream::operator<<((ostringstream *)&ss_e,0x13f7);
                      ::std::__ostream_insert<char,std::char_traits<char>>(poVar9," ",1);
                      paVar3 = &tok.super_string.field_2;
                      tok.super_string._M_dataplus._M_p = (pointer)paVar3;
                      ::std::__cxx11::string::_M_construct<char_const*>
                                ((string *)&tok,
                                 "TODO: Unsupported/Unimplemented Prim type: `{}`. Skipping parsing."
                                 ,"");
                      fmt::format<std::__cxx11::string>
                                ((string *)&vmap,(fmt *)&tok,(string *)&pTy,args);
                      poVar9 = ::std::__ostream_insert<char,std::char_traits<char>>
                                         ((ostream *)&ss_e,(char *)vmap._M_t._M_impl._0_8_,
                                          CONCAT44(vmap._M_t._M_impl.super__Rb_tree_header._M_header
                                                   ._4_4_,vmap._M_t._M_impl.super__Rb_tree_header.
                                                          _M_header._M_color));
                      ::std::__ostream_insert<char,std::char_traits<char>>(poVar9,"\n",1);
                      pp_Var2 = &vmap._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
                      if ((_Base_ptr *)vmap._M_t._M_impl._0_8_ != pp_Var2) {
                        operator_delete((void *)vmap._M_t._M_impl._0_8_,
                                        (ulong)((long)&(vmap._M_t._M_impl.super__Rb_tree_header.
                                                        _M_header._M_parent)->_M_color + 1));
                      }
                      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                           *)tok.super_string._M_dataplus._M_p != paVar3) {
                        operator_delete(tok.super_string._M_dataplus._M_p,
                                        CONCAT71(tok.super_string.field_2._M_allocated_capacity.
                                                 _1_7_,tok.super_string.field_2._M_local_buf[0]) + 1
                                       );
                      }
                      ::std::__cxx11::stringbuf::str();
                      PushWarn(this,(string *)&vmap);
                      if ((_Base_ptr *)vmap._M_t._M_impl._0_8_ != pp_Var2) {
                        operator_delete((void *)vmap._M_t._M_impl._0_8_,
                                        (ulong)((long)&(vmap._M_t._M_impl.super__Rb_tree_header.
                                                        _M_header._M_parent)->_M_color + 1));
                      }
                      ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)&ss_e);
                      ::std::ios_base::~ios_base(local_2f8);
                    }
                    else {
                      p_Var13 = (_Any_data *)::std::map<$40cfd1d7$>::operator[](this_00,&pTy);
                      _c_1 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                              *)0x0;
                      uStack_4c0 = 0;
                      local_4b8._M_allocated_capacity = 0;
                      local_4b8._8_8_ = (_Invoker_type)0x0;
                      if (*(code **)(p_Var13 + 1) != (code *)0x0) {
                        (**(code **)(p_Var13 + 1))((_Any_data *)&c_1,p_Var13,__clone_functor);
                        local_4b8._8_8_ = *(undefined8 *)(p_Var13->_M_pod_data + 0x18);
                        local_4b8._M_allocated_capacity = *(undefined8 *)(p_Var13 + 1);
                      }
                      GetCurrentPrimPath_abi_cxx11_((string *)&ss_e,this);
                      tok.super_string._M_dataplus._M_p = (pointer)&tok.super_string.field_2;
                      ::std::__cxx11::string::_M_construct<char_const*>
                                ((string *)&tok.super_string,"");
                      Path::Path((Path *)&vmap,(string *)&ss_e,&tok.super_string);
                      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                           *)tok.super_string._M_dataplus._M_p != &tok.super_string.field_2) {
                        operator_delete(tok.super_string._M_dataplus._M_p,
                                        CONCAT71(tok.super_string.field_2._M_allocated_capacity.
                                                 _1_7_,tok.super_string.field_2._M_local_buf[0]) + 1
                                       );
                      }
                      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                           *)_ss_e != local_358) {
                        operator_delete(_ss_e,local_358[0]._M_allocated_capacity + 1);
                      }
                      _ss_e = (pointer)local_358;
                      ::std::__cxx11::string::_M_construct<char_const*>((string *)&ss_e,"");
                      Path::Path((Path *)&tok,&prim_name,(string *)&ss_e);
                      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                           *)_ss_e != local_358) {
                        operator_delete(_ss_e,local_358[0]._M_allocated_capacity + 1);
                      }
                      ::std::function<$3792144$>::operator()
                                ((expected<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                  *)&variantName,(function<_3792144_> *)&c_1,(Path *)&vmap,spec,
                                 &prim_type.super_string,(Path *)&tok,primIdx,parentPrimIdx,&props,
                                 &in_metas,&variantSetList);
                      if (local_510 == '\0') {
                        ::std::__cxx11::ostringstream::ostringstream((ostringstream *)&ss_e);
                        ::std::__ostream_insert<char,std::char_traits<char>>
                                  ((ostream *)&ss_e,"[error]",7);
                        ::std::__ostream_insert<char,std::char_traits<char>>
                                  ((ostream *)&ss_e,
                                   "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/ascii-parser.cc"
                                   ,0x56);
                        ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&ss_e,":",1)
                        ;
                        ::std::__ostream_insert<char,std::char_traits<char>>
                                  ((ostream *)&ss_e,"ParseBlock",10);
                        ::std::__ostream_insert<char,std::char_traits<char>>
                                  ((ostream *)&ss_e,"():",3);
                        poVar9 = (ostream *)
                                 ::std::ostream::operator<<((ostringstream *)&ss_e,0x13f1);
                        ::std::__ostream_insert<char,std::char_traits<char>>(poVar9," ",1);
                        ::std::operator+(&local_50,"Constructing Prim type `",
                                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                          *)&pTy);
                        plVar14 = (long *)::std::__cxx11::string::append((char *)&local_50);
                        psVar15 = (size_type *)(plVar14 + 2);
                        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                             *)*plVar14 ==
                            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                             *)psVar15) {
                          local_1e8.field_2._M_allocated_capacity = *psVar15;
                          local_1e8.field_2._8_8_ = plVar14[3];
                          local_1e8._M_dataplus._M_p = (pointer)&local_1e8.field_2;
                        }
                        else {
                          local_1e8.field_2._M_allocated_capacity = *psVar15;
                          local_1e8._M_dataplus._M_p = (pointer)*plVar14;
                        }
                        local_1e8._M_string_length = plVar14[1];
                        *plVar14 = (long)psVar15;
                        plVar14[1] = 0;
                        *(undefined1 *)(plVar14 + 2) = 0;
                        ::std::operator+(&local_388,&local_1e8,&variantName);
                        poVar9 = ::std::__ostream_insert<char,std::char_traits<char>>
                                           ((ostream *)&ss_e,local_388._M_dataplus._M_p,
                                            local_388._M_string_length);
                        ::std::__ostream_insert<char,std::char_traits<char>>(poVar9,"\n",1);
                        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                             *)local_388._M_dataplus._M_p != &local_388.field_2) {
                          operator_delete(local_388._M_dataplus._M_p,
                                          local_388.field_2._M_allocated_capacity + 1);
                        }
                        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                             *)local_1e8._M_dataplus._M_p != &local_1e8.field_2) {
                          operator_delete(local_1e8._M_dataplus._M_p,
                                          local_1e8.field_2._M_allocated_capacity + 1);
                        }
                        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                             *)local_50._M_dataplus._M_p != &local_50.field_2) {
                          operator_delete(local_50._M_dataplus._M_p,
                                          local_50.field_2._M_allocated_capacity + 1);
                        }
                        ::std::__cxx11::stringbuf::str();
                        PushError(this,&local_388);
                        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                             *)local_388._M_dataplus._M_p != &local_388.field_2) {
                          operator_delete(local_388._M_dataplus._M_p,
                                          local_388.field_2._M_allocated_capacity + 1);
                        }
                        ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)&ss_e);
                        ::std::ios_base::~ios_base(local_2f8);
                        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                             *)variantName._M_dataplus._M_p != &variantName.field_2) {
                          operator_delete(variantName._M_dataplus._M_p,
                                          CONCAT71(variantName.field_2._M_allocated_capacity._1_7_,
                                                   variantName.field_2._M_local_buf[0]) + 1);
                        }
                        Path::~Path((Path *)&tok);
                        Path::~Path((Path *)&vmap);
                        if ((_Manager_type)local_4b8._M_allocated_capacity != (_Manager_type)0x0) {
                          (*(code *)local_4b8._M_allocated_capacity)(&c_1,&c_1,3);
                        }
                        goto LAB_0035ac81;
                      }
                      Path::~Path((Path *)&tok);
                      Path::~Path((Path *)&vmap);
                      if ((_Manager_type)local_4b8._M_allocated_capacity != (_Manager_type)0x0) {
                        (*(code *)local_4b8._M_allocated_capacity)(&c_1,&c_1,3);
                      }
                    }
LAB_0035a7fa:
                    bVar5 = true;
                    if ((this->_path_stack).c.
                        super__Deque_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_impl.super__Deque_impl_data._M_finish._M_cur !=
                        (this->_path_stack).c.
                        super__Deque_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_impl.super__Deque_impl_data._M_start._M_cur) {
                      ::std::
                      deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ::pop_back(&local_1f0->c);
                    }
                  }
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)pTy._M_dataplus._M_p != &pTy.field_2) {
                    operator_delete(pTy._M_dataplus._M_p,pTy.field_2._M_allocated_capacity + 1);
                  }
LAB_0035aca0:
                  ::std::
                  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::ascii::AsciiParser::VariantContent,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::ascii::AsciiParser::VariantContent>_>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::ascii::AsciiParser::VariantContent,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::ascii::AsciiParser::VariantContent>_>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::ascii::AsciiParser::VariantContent,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::ascii::AsciiParser::VariantContent>_>_>_>_>_>
                  ::_M_erase(&variantSetList._M_t,
                             (_Link_type)
                             variantSetList._M_t._M_impl.super__Rb_tree_header._M_header._M_parent);
                  ::std::vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>::~vector
                            (&propNames);
                  ::std::
                  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property>_>_>
                  ::_M_erase(&props._M_t,
                             (_Link_type)
                             props._M_t._M_impl.super__Rb_tree_header._M_header._M_parent);
                }
              }
              else {
                bVar5 = false;
              }
              ::std::
              _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<tinyusdz::ListEditQual,_tinyusdz::MetaVariable>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<tinyusdz::ListEditQual,_tinyusdz::MetaVariable>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<tinyusdz::ListEditQual,_tinyusdz::MetaVariable>_>_>_>
              ::_M_erase(&in_metas._M_t,
                         (_Link_type)in_metas._M_t._M_impl.super__Rb_tree_header._M_header._M_parent
                        );
            }
            else {
LAB_00359597:
              bVar5 = false;
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)prim_name._M_dataplus._M_p != &prim_name.field_2) {
              operator_delete(prim_name._M_dataplus._M_p,
                              CONCAT71(prim_name.field_2._M_allocated_capacity._1_7_,
                                       prim_name.field_2._M_local_buf[0]) + 1);
            }
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)prim_type.super_string._M_dataplus._M_p != &prim_type.super_string.field_2) {
            operator_delete(prim_type.super_string._M_dataplus._M_p,
                            CONCAT71(prim_type.super_string.field_2._M_allocated_capacity._1_7_,
                                     prim_type.super_string.field_2._M_local_buf[0]) + 1);
          }
          goto LAB_003591df;
        }
      }
    }
    else {
      ::std::__cxx11::ostringstream::ostringstream((ostringstream *)&ss_e);
      ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&ss_e,"[error]",7);
      ::std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&ss_e,
                 "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/ascii-parser.cc"
                 ,0x56);
      ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&ss_e,":",1);
      ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&ss_e,"ParseBlock",10);
      ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&ss_e,"():",3);
      poVar9 = (ostream *)::std::ostream::operator<<((ostringstream *)&ss_e,0x12d3);
      ::std::__ostream_insert<char,std::char_traits<char>>(poVar9," ",1);
      ::std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&ss_e,"Invalid specifier.",0x12);
      ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)&ss_e,"\n",1);
      ::std::__cxx11::stringbuf::str();
      PushError(this,(string *)&vmap);
      if ((_Base_ptr *)vmap._M_t._M_impl._0_8_ !=
          &vmap._M_t._M_impl.super__Rb_tree_header._M_header._M_parent) {
LAB_003591ab:
        operator_delete((void *)vmap._M_t._M_impl._0_8_,
                        (ulong)((long)&(vmap._M_t._M_impl.super__Rb_tree_header._M_header._M_parent)
                                       ->_M_color + 1));
      }
LAB_003591bb:
      ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)&ss_e);
      ::std::ios_base::~ios_base(local_2f8);
    }
  }
  bVar5 = false;
LAB_003591df:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)def.super_string._M_dataplus._M_p != &def.super_string.field_2) {
    operator_delete(def.super_string._M_dataplus._M_p,
                    CONCAT71(def.super_string.field_2._M_allocated_capacity._1_7_,
                             def.super_string.field_2._M_local_buf[0]) + 1);
  }
  return bVar5;
}

Assistant:

bool AsciiParser::ParseBlock(const Specifier spec, const int64_t primIdx,
                             const int64_t parentPrimIdx, const uint32_t depth,
                             const bool in_variantStaement) {
  (void)in_variantStaement;

  DCOUT("ParseBlock");

  if (!SkipCommentAndWhitespaceAndNewline()) {
    DCOUT("SkipCommentAndWhitespaceAndNewline failed");
    return false;
  }

  Identifier def;
  if (!ReadIdentifier(&def)) {
    DCOUT("ReadIdentifier failed");
    return false;
  }
  DCOUT("spec = " << def);

  if ((def == "def") || (def == "over") || (def == "class")) {
    // ok
  } else {
    PUSH_ERROR_AND_RETURN("Invalid specifier.");
  }

  // Ensure spec and def is same.
  if (def == "def") {
    if (spec != Specifier::Def) {
      PUSH_ERROR_AND_RETURN_TAG(
          kAscii, "Internal error. Invalid Specifier token combination. def = "
                      << def << ", spec = " << to_string(spec));
    }
  } else if (def == "over") {
    if (spec != Specifier::Over) {
      PUSH_ERROR_AND_RETURN_TAG(
          kAscii, "Internal error. Invalid Specifier token combination. def = "
                      << def << ", spec = " << to_string(spec));
    }
  } else if (def == "class") {
    if (spec != Specifier::Class) {
      PUSH_ERROR_AND_RETURN_TAG(
          kAscii, "Internal error. Invalid Specifier token combination. def = "
                      << def << ", spec = " << to_string(spec));
    }
  }

  if (!SkipWhitespaceAndNewline()) {
    return false;
  }

  // look ahead
  bool has_primtype = false;
  {
    char c;
    if (!Char1(&c)) {
      return false;
    }

    if (!Rewind(1)) {
      return false;
    }

    if (c == '"') {
      // token
      has_primtype = false;
    } else {
      has_primtype = true;
    }
  }

  Identifier prim_type;

  DCOUT("has_primtype = " << has_primtype);

  if (has_primtype) {
    if (!ReadIdentifier(&prim_type)) {
      return false;
    }
  }

  if (!SkipWhitespaceAndNewline()) {
    return false;
  }

  std::string prim_name;
  if (!ReadBasicType(&prim_name)) {
    return false;
  }

  DCOUT("prim name = " << prim_name);
  if (!ValidatePrimElementName(prim_name)) {
    PUSH_ERROR_AND_RETURN_TAG(kAscii, "Prim name contains invalid chacracter.");
  }

  if (!SkipWhitespaceAndNewline()) {
    return false;
  }

  std::map<std::string, std::pair<ListEditQual, MetaVariable>> in_metas;
  {
    // look ahead
    char c;
    if (!LookChar1(&c)) {
      return false;
    }

    if (c == '(') {
      // meta

      if (!ParsePrimMetas(&in_metas)) {
        DCOUT("Parse Prim metas failed.");
        return false;
      }

      if (!SkipWhitespaceAndNewline()) {
        return false;
      }
    }
  }

  if (!SkipCommentAndWhitespaceAndNewline()) {
    return false;
  }

  if (!Expect('{')) {
    return false;
  }

  if (!SkipWhitespaceAndNewline()) {
    return false;
  }

  std::map<std::string, Property> props;
  std::vector<value::token> propNames;
  VariantSetList variantSetList;

  {
    std::string full_path = GetCurrentPrimPath();
    if (full_path == "/") {
      full_path += prim_name;
    } else {
      full_path += "/" + prim_name;
    }
    PushPrimPath(full_path);
  }

  // expect = '}'
  //        | def_block
  //        | prim_attr+
  //        | variantSet '{' ... '}'
  while (!Eof()) {
    if (!SkipCommentAndWhitespaceAndNewline()) {
      return false;
    }

    char c;
    if (!Char1(&c)) {
      return false;
    }

    if (c == '}') {
      // end block
      break;
    } else {
      if (!Rewind(1)) {
        return false;
      }

      DCOUT("Read stmt token");
      Identifier tok;
      if (!ReadBasicType(&tok)) {
        // maybe ';'?

        if (LookChar1(&c)) {
          if (c == ';') {
            PUSH_ERROR_AND_RETURN(
                "Semicolon is not allowd in `def` block statement.");
          }
        }
        PUSH_ERROR_AND_RETURN(
            "Failed to parse an identifier in `def` block statement.");
      }

      if (tok == "variantSet") {
        if (!SkipWhitespace()) {
          return false;
        }

        std::string variantName;
        if (!ReadBasicType(&variantName)) {
          PUSH_ERROR_AND_RETURN("Failed to parse `variantSet` statement.");
        }

        DCOUT("variantName = " << variantName);

        if (!SkipWhitespace()) {
          return false;
        }

        if (!Expect('=')) {
          return false;
        }

        if (!SkipWhitespace()) {
          return false;
        }

        std::map<std::string, VariantContent> vmap;
        if (!ParseVariantSet(primIdx, parentPrimIdx, depth, &vmap)) {
          PUSH_ERROR_AND_RETURN("Failed to parse `variantSet` statement.");
        }

        variantSetList.emplace(variantName, vmap);

        continue;
      }

      if (!Rewind(tok.size())) {
        return false;
      }

      Specifier child_spec{Specifier::Invalid};
      if (tok == "def") {
        child_spec = Specifier::Def;
      } else if (tok == "over") {
        child_spec = Specifier::Over;
      } else if (tok == "class") {
        child_spec = Specifier::Class;
      }

      if (child_spec != Specifier::Invalid) {
        int64_t idx = _prim_idx_assign_fun(parentPrimIdx);
        DCOUT("enter parseDef. spec = " << to_string(child_spec) << ", idx = "
                                        << idx << ", rootIdx = " << primIdx);

        // recusive call
        if (!ParseBlock(child_spec, idx, primIdx, depth + 1)) {
          PUSH_ERROR_AND_RETURN(
              fmt::format("`{}` block parse failed.", to_string(child_spec)));
        }
        DCOUT(fmt::format("Done parse `{}` block.", to_string(child_spec)));
      } else {
        DCOUT("Enter ParsePrimProps.");
        // Assume PrimAttr
        if (!ParsePrimProps(&props, &propNames)) {
          PUSH_ERROR_AND_RETURN("Failed to parse Prim attribute.");
        }
      }

      if (!SkipWhitespaceAndNewline()) {
        return false;
      }
    }
  }

  std::string pTy = prim_type;

  if (_primspec_mode) {
    // Load scene as PrimSpec tree
    if (_primspec_fun) {
      Path fullpath(GetCurrentPrimPath(), "");
      Path pname(prim_name, "");

      // pass prim_type as is(empty = empty string)
      nonstd::expected<bool, std::string> ret =
          _primspec_fun(fullpath, spec, prim_type, pname, primIdx,
                        parentPrimIdx, props, in_metas, variantSetList);

      if (!ret) {
        // construction failed.
        PUSH_ERROR_AND_RETURN(fmt::format(
            "Constructing PrimSpec typeName `{}`, elementName `{}` failed: {}",
            prim_type, prim_name, ret.error()));
      }
    } else {
      PUSH_ERROR_AND_RETURN_TAG(
          kAscii, "[Internal Error] PrimSpec handler is not found.");
    }

  } else {
    // Create typed Prim.

    if (prim_type.empty()) {
      // No Prim type specified. Treat it as Model

      pTy = "Model";
    }

    if (!_prim_construct_fun_map.count(pTy)) {
      if (_option.allow_unknown_prim) {
        // Unknown Prim type specified. Treat it as Model
        // Prim's type name will be storead in Model::prim_type_name
        pTy = "Model";
      }
    }

    if (_prim_construct_fun_map.count(pTy)) {
      auto construct_fun = _prim_construct_fun_map[pTy];

      Path fullpath(GetCurrentPrimPath(), "");
      Path pname(prim_name, "");
      nonstd::expected<bool, std::string> ret =
          construct_fun(fullpath, spec, prim_type, pname, primIdx,
                        parentPrimIdx, props, in_metas, variantSetList);

      if (!ret) {
        // construction failed.
        PUSH_ERROR_AND_RETURN("Constructing Prim type `" + pTy +
                              "` failed: " + ret.error());
      }

    } else {
      PUSH_WARN(fmt::format(
          "TODO: Unsupported/Unimplemented Prim type: `{}`. Skipping parsing.",
          pTy));
    }
  }

  PopPrimPath();

  return true;
}